

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Functional::DebugTests::init(DebugTests *this,EVP_PKEY_CTX *ctx)

{
  pointer pTVar1;
  pointer pTVar2;
  undefined8 *puVar3;
  GLenum target;
  undefined4 uVar4;
  Context *pCVar5;
  char *__rhs;
  anon_union_8_2_9b810bd7_for_m_func aVar6;
  _Alloc_hider _Var7;
  pointer pFVar8;
  pointer pFVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int extraout_EAX;
  TestNode *pTVar13;
  LimitQueryCase *pLVar14;
  IsEnabledCase *pIVar15;
  PositiveIntegerCase *pPVar16;
  GroupStackDepthQueryCase *pGVar17;
  TestCase *pTVar18;
  TestNode *pTVar19;
  TestNode *pTVar20;
  BaseCase *this_00;
  FilterCase *pFVar21;
  AsyncCase *pAVar22;
  long lVar23;
  string *psVar24;
  int iVar25;
  long lVar26;
  char *pcVar27;
  QueryType type;
  undefined8 uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  *this_01;
  ulong uVar32;
  pointer __args;
  ulong uVar33;
  bool bVar34;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs;
  string name;
  uint local_2c0;
  allocator<char> local_2b9;
  TestNode *local_2b8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs_2;
  ulong local_288;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  containers;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  allFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  externalFuncs;
  Random rng;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  textureFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  bufferFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  computeFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderStorageFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  advancedBlendFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  preciseFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ssboBlockFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderDirectiveFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFunctionFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicExchangeFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageStoreFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageLoadFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  atomicCounterFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  tessellationFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  stateFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  vaFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  fragmentFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFuncs;
  
  NegativeTestShared::getNegativeBufferApiTestFunctions();
  wrapCoreFunctions(&bufferFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeTextureApiTestFunctions();
  wrapCoreFunctions(&textureFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderApiTestFunctions();
  wrapCoreFunctions(&shaderFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeFragmentApiTestFunctions();
  wrapCoreFunctions(&fragmentFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeVertexArrayApiTestFunctions();
  wrapCoreFunctions(&vaFuncs,(vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                              *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeStateApiTestFunctions();
  wrapCoreFunctions(&stateFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeTessellationTestFunctions();
  wrapCoreFunctions(&tessellationFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeAtomicCounterTestFunctions();
  wrapCoreFunctions(&atomicCounterFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderImageLoadTestFunctions();
  wrapCoreFunctions(&imageLoadFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderImageStoreTestFunctions();
  wrapCoreFunctions(&imageStoreFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderImageAtomicTestFunctions();
  wrapCoreFunctions(&imageAtomicFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions();
  wrapCoreFunctions(&imageAtomicExchangeFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderFunctionTestFunctions();
  wrapCoreFunctions(&shaderFunctionFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderDirectiveTestFunctions();
  wrapCoreFunctions(&shaderDirectiveFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeSSBOBlockTestFunctions();
  wrapCoreFunctions(&ssboBlockFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativePreciseTestFunctions();
  wrapCoreFunctions(&preciseFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions();
  wrapCoreFunctions(&advancedBlendFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeShaderStorageTestFunctions();
  wrapCoreFunctions(&shaderStorageFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  NegativeTestShared::getNegativeComputeTestFunctions();
  wrapCoreFunctions(&computeFuncs,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&name);
  std::
  _Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  ::~_Vector_base((_Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                   *)&name);
  name._M_dataplus._M_p._0_4_ = 2;
  name._M_string_length = (size_type)anon_unknown_1::application_messages;
  name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_9b5ed;
  name.field_2._8_8_ = anon_var_dwarf_9b5f9;
  externalFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  externalFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  externalFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  externalFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x60);
  externalFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       externalFuncs.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ._M_impl.super__Vector_impl_data._M_start + 3;
  for (lVar23 = 0;
      externalFuncs.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)&((externalFuncs.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                              ._M_impl.super__Vector_impl_data._M_start)->function).m_type + lVar23)
      , lVar23 != 0x60; lVar23 = lVar23 + 0x20) {
    uVar28 = *(undefined8 *)((long)&name._M_dataplus._M_p + lVar23);
    aVar6 = *(anon_union_8_2_9b810bd7_for_m_func *)((long)&name._M_string_length + lVar23);
    pcVar27 = *(char **)((long)&name.field_2 + lVar23 + 8);
    (externalFuncs.
     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
     ._M_impl.super__Vector_impl_data._M_finish)->name = *(char **)((long)&name.field_2 + lVar23);
    (externalFuncs.
     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
     ._M_impl.super__Vector_impl_data._M_finish)->desc = pcVar27;
    *(undefined8 *)
     &(externalFuncs.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ._M_impl.super__Vector_impl_data._M_finish)->function = uVar28;
    ((externalFuncs.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_finish)->function).m_func = aVar6;
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  local_2b8 = pTVar13;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  pTVar13 = local_2b8;
  for (lVar23 = 0x14; lVar23 != 0x74; lVar23 = lVar23 + 0x18) {
    pLVar14 = (LimitQueryCase *)operator_new(0x88);
    pCVar5 = (this->super_TestCaseGroup).m_context;
    pcVar27 = *(char **)((long)&PTR_deinit_00a07e18 + lVar23 + 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcs,pcVar27,(allocator<char> *)&allFuncs);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs
                   ,"_getboolean");
    _Var7 = name._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&containers,"Test ",(allocator<char> *)&rng);
    __rhs = *(char **)((long)&PTR_iterate_00a07e20 + lVar23 + 4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containers,
                   __rhs);
    target = *(GLenum *)(&UNK_00a07e2c + lVar23);
    iVar11 = *(int *)((long)&init::limits[0].name + lVar23);
    anon_unknown_1::LimitQueryCase::LimitQueryCase
              (pLVar14,pCVar5,_Var7._M_p,
               (char *)CONCAT44(funcs_2.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)funcs_2.
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                     ._M_impl.super__Vector_impl_data._M_start),target,iVar11,
               QUERY_BOOLEAN);
    tcu::TestNode::addChild(local_2b8,(TestNode *)pLVar14);
    std::__cxx11::string::~string((string *)&funcs_2);
    std::__cxx11::string::~string((string *)&containers);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&funcs);
    pLVar14 = (LimitQueryCase *)operator_new(0x88);
    pCVar5 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcs,pcVar27,(allocator<char> *)&allFuncs);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs
                   ,"_getinteger");
    _Var7 = name._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&containers,"Test ",(allocator<char> *)&rng);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containers,
                   __rhs);
    anon_unknown_1::LimitQueryCase::LimitQueryCase
              (pLVar14,pCVar5,_Var7._M_p,
               (char *)CONCAT44(funcs_2.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)funcs_2.
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                     ._M_impl.super__Vector_impl_data._M_start),target,iVar11,
               QUERY_INTEGER);
    tcu::TestNode::addChild(local_2b8,(TestNode *)pLVar14);
    std::__cxx11::string::~string((string *)&funcs_2);
    std::__cxx11::string::~string((string *)&containers);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&funcs);
    pLVar14 = (LimitQueryCase *)operator_new(0x88);
    pCVar5 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcs,pcVar27,(allocator<char> *)&allFuncs);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs
                   ,"_getinteger64");
    _Var7 = name._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&containers,"Test ",(allocator<char> *)&rng);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containers,
                   __rhs);
    anon_unknown_1::LimitQueryCase::LimitQueryCase
              (pLVar14,pCVar5,_Var7._M_p,
               (char *)CONCAT44(funcs_2.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)funcs_2.
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                     ._M_impl.super__Vector_impl_data._M_start),target,iVar11,
               QUERY_INTEGER64);
    tcu::TestNode::addChild(local_2b8,(TestNode *)pLVar14);
    std::__cxx11::string::~string((string *)&funcs_2);
    std::__cxx11::string::~string((string *)&containers);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&funcs);
    pLVar14 = (LimitQueryCase *)operator_new(0x88);
    pCVar5 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcs,pcVar27,(allocator<char> *)&allFuncs);
    pTVar13 = local_2b8;
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs
                   ,"_getfloat");
    _Var7 = name._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&containers,"Test ",(allocator<char> *)&rng);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containers,
                   __rhs);
    anon_unknown_1::LimitQueryCase::LimitQueryCase
              (pLVar14,pCVar5,_Var7._M_p,
               (char *)CONCAT44(funcs_2.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)funcs_2.
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                     ._M_impl.super__Vector_impl_data._M_start),target,iVar11,
               QUERY_FLOAT);
    tcu::TestNode::addChild(pTVar13,(TestNode *)pLVar14);
    std::__cxx11::string::~string((string *)&funcs_2);
    std::__cxx11::string::~string((string *)&containers);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&funcs);
  }
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_isenabled");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
             QUERY_ISENABLED);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getboolean");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
             QUERY_BOOLEAN);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
             QUERY_INTEGER);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger64");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
             QUERY_INTEGER64);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getfloat");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT",0x92e0,INITIAL_CTX_IS_DEBUG,
             QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output_synchronous",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_isenabled");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,
             INITIAL_FALSE,QUERY_ISENABLED);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output_synchronous",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getboolean");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,
             INITIAL_FALSE,QUERY_BOOLEAN);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output_synchronous",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,
             INITIAL_FALSE,QUERY_INTEGER);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output_synchronous",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger64");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,
             INITIAL_FALSE,QUERY_INTEGER64);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pIVar15 = (IsEnabledCase *)operator_new(0x88);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_output_synchronous",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getfloat");
  anon_unknown_1::IsEnabledCase::IsEnabledCase
            (pIVar15,pCVar5,name._M_dataplus._M_p,"Test DEBUG_OUTPUT_SYNCHRONOUS",0x8242,
             INITIAL_FALSE,QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pIVar15);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_logged_messages",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getboolean");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_BOOLEAN)
  ;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_logged_messages",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_INTEGER)
  ;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_logged_messages",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger64");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_LOGGED_MESSAGES",0x9145,
             QUERY_INTEGER64);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_logged_messages",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getfloat");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_LOGGED_MESSAGES",0x9145,QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_next_logged_message_length",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getboolean");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,
             QUERY_BOOLEAN);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_next_logged_message_length",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,
             QUERY_INTEGER);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_next_logged_message_length",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger64");
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,
             QUERY_INTEGER64);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pPVar16 = (PositiveIntegerCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_next_logged_message_length",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getfloat");
  uVar28 = 5;
  type = 0x8243;
  anon_unknown_1::PositiveIntegerCase::PositiveIntegerCase
            (pPVar16,pCVar5,name._M_dataplus._M_p,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",0x8243,
             QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pPVar16);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pGVar17 = (GroupStackDepthQueryCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_group_stack_depth",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getboolean");
  anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
            (pGVar17,pCVar5,name._M_dataplus._M_p,(char *)0x0,type);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pGVar17);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pGVar17 = (GroupStackDepthQueryCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_group_stack_depth",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger");
  anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
            (pGVar17,pCVar5,name._M_dataplus._M_p,(char *)0x3,type);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pGVar17);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pGVar17 = (GroupStackDepthQueryCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_group_stack_depth",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getinteger64");
  anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
            (pGVar17,pCVar5,name._M_dataplus._M_p,(char *)0x4,type);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pGVar17);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pGVar17 = (GroupStackDepthQueryCase *)operator_new(0x80);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs,"debug_group_stack_depth",(allocator<char> *)&funcs_2);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                 "_getfloat");
  anon_unknown_1::GroupStackDepthQueryCase::GroupStackDepthQueryCase
            (pGVar17,pCVar5,name._M_dataplus._M_p,(char *)0x5,type);
  tcu::TestNode::addChild(pTVar13,(TestNode *)pGVar17);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&funcs);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,
                     "debug_callback_function_getpointer","Test DEBUG_CALLBACK_FUNCTION");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a080e8;
  tcu::TestNode::addChild(local_2b8,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,
                     "debug_callback_user_param_getpointer","Test DEBUG_CALLBACK_USER_PARAM");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a08138;
  tcu::TestNode::addChild(local_2b8,(TestNode *)pTVar18);
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative_coverage","API error coverage with various reporting methods");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  pTVar19 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar19,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"callbacks",
             "Reporting of standard API errors via callback");
  tcu::TestNode::addChild(pTVar13,pTVar19);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",&bufferFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",&textureFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",&shaderFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",&fragmentFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"vertex_array"
                              ,"Negative Vertex Array API Cases",&vaFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",&stateFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "atomic_counter","Negative Atomic Counter API Cases",
                              &atomicCounterFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_load","Negative Shader Image Load API Cases",
                              &imageLoadFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &imageStoreFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &imageAtomicFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",
                              &imageAtomicExchangeFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_function","Negative Shader Function Cases",
                              &shaderFunctionFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_directive","Negative Shader Directive Cases",
                              &shaderDirectiveFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",&ssboBlockFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",&preciseFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "advanced_blend","Negative Advanced Blend Equation Cases",
                              &advancedBlendFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_storage","Negative Shader Storage Cases",&shaderStorageFuncs)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"tessellation"
                              ,"Negative Tessellation Cases",&tessellationFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",&computeFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar19 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar19,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"log",
             "Reporting of standard API errors via log");
  tcu::TestNode::addChild(pTVar13,pTVar19);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",&bufferFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",&textureFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",&shaderFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",&fragmentFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"vertex_array",
                              "Negative Vertex Array API Cases",&vaFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",&stateFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"atomic_counter",
                              "Negative Atomic Counter API Cases",&atomicCounterFuncs)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_image_load"
                              ,"Negative Shader Image Load API Cases",&imageLoadFuncs)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &imageStoreFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &imageAtomicFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",
                              &imageAtomicExchangeFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_function",
                              "Negative Shader Function Cases",&shaderFunctionFuncs)->super_TestNode
  ;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_directive",
                              "Negative Shader Directive Cases",&shaderDirectiveFuncs)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",&ssboBlockFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",&preciseFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"advanced_blend",
                              "Negative Advanced Blend Equation Cases",&advancedBlendFuncs)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_storage",
                              "Negative Shader Storage Cases",&shaderStorageFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"tessellation",
                              "Negative Tessellation Cases",&tessellationFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar20 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",&computeFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar20);
  pTVar19 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar19,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"get_error",
             "Reporting of standard API errors via glGetError");
  tcu::TestNode::addChild(pTVar13,pTVar19);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",&bufferFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",&textureFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",&shaderFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",&fragmentFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"vertex_array"
                              ,"Negative Vertex Array API Cases",&vaFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",&stateFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "atomic_counter","Negative Atomic Counter API Cases",
                              &atomicCounterFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_image_load","Negative Shader Image Load API Cases",
                              &imageLoadFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &imageStoreFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &imageAtomicFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",
                              &imageAtomicExchangeFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_function","Negative Shader Function Cases",
                              &shaderFunctionFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_directive","Negative Shader Directive Cases",
                              &shaderDirectiveFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",&ssboBlockFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",&preciseFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "advanced_blend","Negative Advanced Blend Equation Cases",
                              &advancedBlendFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                              "shader_storage","Negative Shader Storage Cases",&shaderStorageFuncs)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"tessellation"
                              ,"Negative Tessellation Cases",&tessellationFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",&computeFuncs)->super_TestNode;
  tcu::TestNode::addChild(pTVar19,pTVar13);
  pTVar13 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "externally_generated","Externally Generated Messages",&externalFuncs)
             ->super_TestNode;
  this_00 = (BaseCase *)operator_new(0xf8);
  anon_unknown_1::BaseCase::BaseCase
            (this_00,(this->super_TestCaseGroup).m_context,"push_pop_consistency",
             "Push/pop message generation with full message output checking");
  (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GroupCase_00a08328;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0x0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       (pointer)&this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
                 field_2;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
       0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
  _M_local_buf[0] = '\0';
  tcu::TestNode::addChild(pTVar13,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  containers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  containers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  containers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allFuncs.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCaseGroup).m_context)->m_testCtx->m_cmdLine);
  deRandom_init(&rng.m_rnd,uVar10 ^ 0x53941903);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&containers,(const_iterator)0x0,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )bufferFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )bufferFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&containers,
             (const_iterator)
             containers.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )textureFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )textureFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  pFVar9 = externalFuncs.
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar8 = externalFuncs.
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&containers,
             (const_iterator)
             containers.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )externalFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )externalFuncs.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  lVar23 = (long)containers.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)containers.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  __args = containers.
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    bVar34 = lVar23 == 0;
    lVar23 = lVar23 + -1;
    if (bVar34) break;
    if (allFuncs.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        allFuncs.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
      ::
      _M_realloc_insert<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const&>
                ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                  *)&allFuncs,
                 (iterator)
                 allFuncs.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&__args->function);
    }
    else {
      uVar4 = *(undefined4 *)&(__args->function).field_0x4;
      aVar6 = (__args->function).m_func;
      (allFuncs.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
       ._M_impl.super__Vector_impl_data._M_finish)->m_type = (__args->function).m_type;
      *(undefined4 *)
       &(allFuncs.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = uVar4;
      (allFuncs.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
       ._M_impl.super__Vector_impl_data._M_finish)->m_func = aVar6;
      allFuncs.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           allFuncs.
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    __args = __args + 1;
  }
  local_2b8 = (TestNode *)
              allFuncs.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar32 = (ulong)((long)allFuncs.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)allFuncs.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 4;
  uVar33 = uVar32;
  while( true ) {
    uVar33 = uVar33 - 1;
    uVar10 = (uint)uVar33;
    if ((int)uVar10 < 1) break;
    iVar11 = de::Random::getInt(&rng,0,uVar10);
    name._M_dataplus._M_p = *(pointer *)((long)local_2b8 + (ulong)(uVar10 & 0x7fffffff) * 0x10);
    name._M_string_length =
         *(size_type *)&((pointer)((long)local_2b8 + (ulong)(uVar10 & 0x7fffffff) * 0x10))->m_func;
    pTVar1 = (pointer)((long)local_2b8 + (long)iVar11 * 0x10);
    uVar4 = *(undefined4 *)&pTVar1->field_0x4;
    aVar6 = pTVar1->m_func;
    pTVar2 = (pointer)((long)local_2b8 + (ulong)(uVar10 & 0x7fffffff) * 0x10);
    pTVar2->m_type = pTVar1->m_type;
    *(undefined4 *)&pTVar2->field_0x4 = uVar4;
    pTVar2->m_func = aVar6;
    *(pointer *)((long)local_2b8 + (long)iVar11 * 0x10) = name._M_dataplus._M_p;
    ((pointer)((long)local_2b8 + (long)iVar11 * 0x10))->m_func =
         (anon_union_8_2_9b810bd7_for_m_func)name._M_string_length;
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "error_filters","Filtering of reported errors");
  iVar11 = (int)uVar32;
  iVar29 = (iVar11 + 3) / 4;
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  iVar12 = 0x20;
  if (iVar29 < 0x20) {
    iVar12 = iVar29;
  }
  uVar33 = (long)pFVar9 - (long)pFVar8 >> 5;
  iVar25 = 0;
  while( true ) {
    funcs_2.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar25;
    if (iVar12 <= iVar25) break;
    iVar30 = iVar25 * 4 + 4;
    if (iVar11 <= iVar30) {
      iVar30 = iVar11;
    }
    de::toString<int>((string *)&funcs,(int *)&funcs_2);
    pcVar27 = "case_";
    std::operator+(&name,"case_",(string *)&funcs);
    std::__cxx11::string::~string((string *)&funcs);
    lVar26 = (long)(iVar25 << 2);
    funcs.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    funcs.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    funcs.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar31 = (long)iVar30 * 0x10 + lVar26 * -0x10;
    this_01 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               *)(lVar31 >> 4);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::_S_check_init_len((size_type)this_01,(allocator_type *)pcVar27);
    funcs.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ._M_impl.super__Vector_impl_data._M_start =
         std::
         _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ::_M_allocate(this_01,(size_t)pcVar27);
    funcs.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         funcs.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
         ._M_impl.super__Vector_impl_data._M_start + (iVar30 - lVar26);
    for (lVar23 = 0;
        funcs.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)&(funcs.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar23),
        lVar31 != lVar23; lVar23 = lVar23 + 0x10) {
      puVar3 = (undefined8 *)((long)&((pointer)((long)local_2b8 + lVar26 * 0x10))->m_type + lVar23);
      aVar6 = *(anon_union_8_2_9b810bd7_for_m_func *)(puVar3 + 1);
      *(undefined8 *)
       funcs.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
       ._M_impl.super__Vector_impl_data._M_finish = *puVar3;
      (funcs.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
       ._M_impl.super__Vector_impl_data._M_finish)->m_func = aVar6;
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::insert(&funcs,(const_iterator)
                    funcs.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
             &pFVar8[(ulong)(long)(int)funcs_2.
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                       ._M_impl.super__Vector_impl_data._M_start % uVar33].function)
    ;
    pFVar21 = (FilterCase *)operator_new(0xe8);
    anon_unknown_1::FilterCase::FilterCase
              (pFVar21,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               "DebugMessageControl usage",&funcs);
    tcu::TestNode::addChild(pTVar13,(TestNode *)pFVar21);
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::~_Vector_base((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)&funcs);
    std::__cxx11::string::~string((string *)&name);
    iVar25 = (int)funcs_2.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  pcVar27 = "Filtering of reported errors with use of Error Groups";
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"error_groups"
             ,"Filtering of reported errors with use of Error Groups");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  local_288 = 0x10;
  if (0xf < iVar29) {
    iVar29 = 0x10;
  }
  uVar10 = 0;
  while( true ) {
    local_2c0 = uVar10;
    if (iVar29 <= (int)uVar10) break;
    iVar12 = uVar10 * 4 + 4;
    if (iVar11 <= iVar12) {
      iVar12 = iVar11;
    }
    de::toString<int>((string *)&funcs_2,(int *)&local_2c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                   "case_",(string *)&funcs_2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,
               (char *)funcs.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_2b9);
    std::__cxx11::string::~string((string *)&funcs);
    std::__cxx11::string::~string((string *)&funcs_2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
    ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                *)&funcs,(TestFunctionWrapper *)((long)local_2b8 + (long)(int)(uVar10 << 2) * 0x10),
               (TestFunctionWrapper *)((long)local_2b8 + (long)iVar12 * 0x10),
               (allocator_type *)pcVar27);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::insert(&funcs,(const_iterator)
                    funcs.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
             &pFVar8[(ulong)(long)(int)local_2c0 % uVar33].function);
    pFVar21 = (FilterCase *)operator_new(0xe8);
    pcVar27 = "Debug Group usage";
    anon_unknown_1::FilterCase::FilterCase
              (pFVar21,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               "Debug Group usage",&funcs);
    (pFVar21->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode = (_func_int **)&PTR__FilterCase_00a083f8;
    tcu::TestNode::addChild(pTVar13,(TestNode *)pFVar21);
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::~_Vector_base((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)&funcs);
    std::__cxx11::string::~string((string *)&name);
    uVar10 = local_2c0 + 1;
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"async",
             "Asynchronous message generation");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  uVar33 = (long)(iVar11 + 1) / 2;
  if ((int)uVar33 < 0x10) {
    local_288 = uVar33;
  }
  psVar24 = (string *)(local_288 & 0xffffffff);
  uVar10 = 0;
  while( true ) {
    local_2c0 = uVar10;
    if ((int)local_288 <= (int)uVar10) break;
    iVar12 = uVar10 * 2 + 2;
    if (iVar11 <= iVar12) {
      iVar12 = iVar11;
    }
    de::toString<int>((string *)&funcs_2,(int *)&local_2c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                   "case_",(string *)&funcs_2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,
               (char *)funcs.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_2b9);
    std::__cxx11::string::~string((string *)&funcs);
    std::__cxx11::string::~string((string *)&funcs_2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
    ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                *)&funcs_2,(TestFunctionWrapper *)((long)local_2b8 + (long)(int)(uVar10 * 2) * 0x10)
               ,(TestFunctionWrapper *)((long)local_2b8 + (long)iVar12 * 0x10),
               (allocator_type *)psVar24);
    psVar24 = (string *)&funcs_2;
    if ((local_2c0 & 1) == 0) {
      pAVar22 = (AsyncCase *)operator_new(0x120);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                     &name,"_log");
      anon_unknown_1::AsyncCase::AsyncCase
                (pAVar22,pCVar5,
                 (char *)funcs.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                         ._M_impl.super__Vector_impl_data._M_start,(char *)&funcs_2,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)0x0,SUB81(uVar28,0));
      tcu::TestNode::addChild(pTVar13,(TestNode *)pAVar22);
    }
    else {
      pAVar22 = (AsyncCase *)operator_new(0x120);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs,
                     &name,"_callback");
      anon_unknown_1::AsyncCase::AsyncCase
                (pAVar22,pCVar5,
                 (char *)funcs.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                         ._M_impl.super__Vector_impl_data._M_start,(char *)&funcs_2,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)0x1,SUB81(uVar28,0));
      tcu::TestNode::addChild(pTVar13,(TestNode *)pAVar22);
    }
    std::__cxx11::string::~string((string *)&funcs);
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
    ::~_Vector_base((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                     *)&funcs_2);
    std::__cxx11::string::~string((string *)&name);
    uVar10 = local_2c0 + 1;
  }
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ::~_Vector_base(&allFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&containers.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "object_labels","Labeling objects");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"initial",
                     "Debug label initial value");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a084c8;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"clearing","Debug label clearing"
                    );
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a08518;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"specify_with_length",
                     "Debug label specified with length");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a085a0;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"buffer_limited_query",
                     "Debug label query to too short buffer");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a085f0;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"max_label_length",
                     "Max sized debug label");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a08640;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"query_length_only",
                     "Query debug label length");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a08690;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  for (lVar23 = 0x10; lVar23 != 0x100; lVar23 = lVar23 + 0x18) {
    pTVar18 = (TestCase *)operator_new(0x80);
    uVar4 = *(undefined4 *)((long)&init::limits[3].targetName + lVar23);
    TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,
                       *(char **)((long)&init::limits[3].target + lVar23),
                       *(char **)((long)&DAT_00a07e90 + lVar23));
    (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a086e0;
    *(undefined4 *)&pTVar18[1].super_TestCase.super_TestNode._vptr_TestNode = uVar4;
    tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  }
  pTVar18 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar18,(this->super_TestCaseGroup).m_context,"sync",
                     "Debug label on a sync object");
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a08730;
  tcu::TestNode::addChild(pTVar13,(TestNode *)pTVar18);
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&externalFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&computeFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&shaderStorageFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&advancedBlendFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&preciseFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&ssboBlockFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&shaderDirectiveFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&shaderFunctionFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&imageAtomicExchangeFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&imageAtomicFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&imageStoreFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&imageLoadFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&atomicCounterFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&tessellationFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&stateFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&vaFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&fragmentFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&shaderFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&textureFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::~_Vector_base(&bufferFuncs.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 );
  return extraout_EAX;
}

Assistant:

void DebugTests::init (void)
{
	const vector<FunctionContainer> bufferFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeBufferApiTestFunctions());
	const vector<FunctionContainer> textureFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeTextureApiTestFunctions());
	const vector<FunctionContainer> shaderFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderApiTestFunctions());
	const vector<FunctionContainer> fragmentFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeFragmentApiTestFunctions());
	const vector<FunctionContainer> vaFuncs					 = wrapCoreFunctions(NegativeTestShared::getNegativeVertexArrayApiTestFunctions());
	const vector<FunctionContainer> stateFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeStateApiTestFunctions());
	const vector<FunctionContainer> tessellationFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeTessellationTestFunctions());
	const vector<FunctionContainer> atomicCounterFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAtomicCounterTestFunctions());
	const vector<FunctionContainer> imageLoadFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageLoadTestFunctions());
	const vector<FunctionContainer> imageStoreFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageStoreTestFunctions());
	const vector<FunctionContainer> imageAtomicFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicTestFunctions());
	const vector<FunctionContainer> imageAtomicExchangeFuncs = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions());
	const vector<FunctionContainer> shaderFunctionFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderFunctionTestFunctions());
	const vector<FunctionContainer> shaderDirectiveFuncs	 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderDirectiveTestFunctions());
	const vector<FunctionContainer> ssboBlockFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeSSBOBlockTestFunctions());
	const vector<FunctionContainer> preciseFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativePreciseTestFunctions());
	const vector<FunctionContainer> advancedBlendFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions());
	const vector<FunctionContainer> shaderStorageFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderStorageTestFunctions());
	const vector<FunctionContainer> computeFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeComputeTestFunctions());
	const vector<FunctionContainer> externalFuncs			 = getUserMessageFuncs();

	{
		using namespace gls::StateQueryUtil;

		tcu::TestCaseGroup* const queries = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query");

		static const struct
		{
			const char*	name;
			const char*	targetName;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{ "max_debug_message_length",		"MAX_DEBUG_MESSAGE_LENGTH",		GL_MAX_DEBUG_MESSAGE_LENGTH,	1	},
			{ "max_debug_logged_messages",		"MAX_DEBUG_LOGGED_MESSAGES",	GL_MAX_DEBUG_LOGGED_MESSAGES,	1	},
			{ "max_debug_group_stack_depth",	"MAX_DEBUG_GROUP_STACK_DEPTH",	GL_MAX_DEBUG_GROUP_STACK_DEPTH,	64	},
			{ "max_label_length",				"MAX_LABEL_LENGTH",				GL_MAX_LABEL_LENGTH,			256	},
		};

		addChild(queries);

		#define FOR_ALL_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_getboolean"; \
					const QueryType		queryType = QUERY_BOOLEAN; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger"; \
					const QueryType		queryType = QUERY_INTEGER; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger64"; \
					const QueryType		queryType = QUERY_INTEGER64; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getfloat"; \
					const QueryType		queryType = QUERY_FLOAT; \
					X; \
				} \
			} \
			while (deGetFalse())
		#define FOR_ALL_ENABLE_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_isenabled"; \
					const QueryType		queryType = QUERY_ISENABLED; \
					X; \
				} \
				FOR_ALL_TYPES(X); \
			} \
			while (deGetFalse())

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
		{
			FOR_ALL_TYPES(queries->addChild(new LimitQueryCase(m_context,
															   (std::string(limits[ndx].name) + postfix).c_str(),
															   (std::string("Test ") + limits[ndx].targetName).c_str(),
															   limits[ndx].target, limits[ndx].limit, queryType)));
		}

		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output") + postfix).c_str(),						"Test DEBUG_OUTPUT",						GL_DEBUG_OUTPUT,				IsEnabledCase::INITIAL_CTX_IS_DEBUG,	queryType)));
		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output_synchronous") + postfix).c_str(),			"Test DEBUG_OUTPUT_SYNCHRONOUS",			GL_DEBUG_OUTPUT_SYNCHRONOUS,	IsEnabledCase::INITIAL_FALSE,			queryType)));

		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_logged_messages") + postfix).c_str(),				"Test DEBUG_LOGGED_MESSAGES",				GL_DEBUG_LOGGED_MESSAGES,				queryType)));
		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_next_logged_message_length") + postfix).c_str(),	"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",	GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH,	queryType)));
		FOR_ALL_TYPES(queries->addChild(new GroupStackDepthQueryCase(m_context, (std::string("debug_group_stack_depth") + postfix).c_str(),				"Test DEBUG_GROUP_STACK_DEPTH",				queryType)));

		queries->addChild(new DebugCallbackFunctionCase	(m_context, "debug_callback_function_getpointer",	"Test DEBUG_CALLBACK_FUNCTION"));
		queries->addChild(new DebugCallbackUserParamCase(m_context, "debug_callback_user_param_getpointer", "Test DEBUG_CALLBACK_USER_PARAM"));

		#undef FOR_ALL_TYPES
		#undef FOR_ALL_ENABLE_TYPES
	}

	{
		tcu::TestCaseGroup* const	negative	= new tcu::TestCaseGroup(m_testCtx, "negative_coverage", "API error coverage with various reporting methods");

		addChild(negative);
		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "callbacks", "Reporting of standard API errors via callback");

			negative->addChild(host);
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "log", "Reporting of standard API errors via log");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_LOG, m_context, "buffer",					"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader",					"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "fragment",				"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "vertex_array",			"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "state",					"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "atomic_counter",			"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_load",		"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_store",		"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_exchange",	"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_directive",		"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "ssbo_block",				"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "advanced_blend",			"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_storage",			"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "tessellation",			"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "get_error", "Reporting of standard API errors via glGetError");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}
	}

	{
		tcu::TestCaseGroup* const host = createChildCases(CASETYPE_CALLBACK, m_context, "externally_generated", "Externally Generated Messages", externalFuncs);

		host->addChild(new GroupCase(m_context, "push_pop_consistency", "Push/pop message generation with full message output checking"));

		addChild(host);
	}

	{
		vector<FunctionContainer>	containers;
		vector<TestFunctionWrapper>	allFuncs;

		de::Random					rng			(0x53941903 ^ m_context.getTestContext().getCommandLine().getBaseSeed());

		containers.insert(containers.end(), bufferFuncs.begin(), bufferFuncs.end());
		containers.insert(containers.end(), textureFuncs.begin(), textureFuncs.end());
		containers.insert(containers.end(), externalFuncs.begin(), externalFuncs.end());

		for (size_t ndx = 0; ndx < containers.size(); ndx++)
			allFuncs.push_back(containers[ndx].function);

		rng.shuffle(allFuncs.begin(), allFuncs.end());

		{
			tcu::TestCaseGroup* const	filtering				= new tcu::TestCaseGroup(m_testCtx, "error_filters", "Filtering of reported errors");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 32;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(filtering);

			for (int caseNdx = 0; caseNdx < de::min(caseCount, maxFilteringCaseCount); caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= "case_" + de::toString(caseNdx);
				vector<TestFunctionWrapper>	funcs		(allFuncs.begin()+start, allFuncs.begin()+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				filtering->addChild(new FilterCase(m_context, name.c_str(), "DebugMessageControl usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	groups					= new tcu::TestCaseGroup(m_testCtx, "error_groups", "Filtering of reported errors with use of Error Groups");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 16;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(groups);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxFilteringCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				groups->addChild(new GroupFilterCase(m_context, name.c_str(), "Debug Group usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	async				= new tcu::TestCaseGroup(m_testCtx, "async", "Asynchronous message generation");
			const int					errorFuncsPerCase	= 2;
			const int					maxAsyncCaseCount	= 16;
			const int					caseCount			= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(async);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxAsyncCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				if (caseNdx&0x1)
					async->addChild(new AsyncCase(m_context, (name+"_callback").c_str(), "Async message generation", funcs, true));
				else
					async->addChild(new AsyncCase(m_context, (name+"_log").c_str(), "Async message generation", funcs, false));
			}
		}
	}

	{
		tcu::TestCaseGroup* const labels = new tcu::TestCaseGroup(m_testCtx, "object_labels", "Labeling objects");

		const struct
		{
			GLenum		identifier;
			const char*	name;
			const char* desc;
		} cases[] =
		{
			{ GL_BUFFER,				"buffer",				"Debug label on a buffer object"				},
			{ GL_SHADER,				"shader",				"Debug label on a shader object"				},
			{ GL_PROGRAM,				"program",				"Debug label on a program object"				},
			{ GL_QUERY,					"query",				"Debug label on a query object"					},
			{ GL_PROGRAM_PIPELINE,		"program_pipeline",		"Debug label on a program pipeline object"		},
			{ GL_TRANSFORM_FEEDBACK,	"transform_feedback",	"Debug label on a transform feedback object"	},
			{ GL_SAMPLER,				"sampler",				"Debug label on a sampler object"				},
			{ GL_TEXTURE,				"texture",				"Debug label on a texture object"				},
			{ GL_RENDERBUFFER,			"renderbuffer",			"Debug label on a renderbuffer object"			},
			{ GL_FRAMEBUFFER,			"framebuffer",			"Debug label on a framebuffer object"			},
		};

		addChild(labels);

		labels->addChild(new InitialLabelCase		(m_context, "initial",				"Debug label initial value"));
		labels->addChild(new ClearLabelCase			(m_context, "clearing",				"Debug label clearing"));
		labels->addChild(new SpecifyWithLengthCase	(m_context, "specify_with_length",	"Debug label specified with length"));
		labels->addChild(new BufferLimitedLabelCase	(m_context, "buffer_limited_query",	"Debug label query to too short buffer"));
		labels->addChild(new LabelMaxSizeCase		(m_context, "max_label_length",		"Max sized debug label"));
		labels->addChild(new LabelLengthCase		(m_context, "query_length_only",	"Query debug label length"));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
			labels->addChild(new LabelCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].identifier));
		labels->addChild(new SyncLabelCase(m_context, "sync", "Debug label on a sync object"));
	}
}